

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

void * stbi__do_png(stbi__png *p,int *x,int *y,int *n,int req_comp,stbi__result_info *ri)

{
  int iVar1;
  stbi__png *local_48;
  void *result;
  stbi__result_info *ri_local;
  int req_comp_local;
  int *n_local;
  int *y_local;
  int *x_local;
  stbi__png *p_local;
  
  local_48 = (stbi__png *)0x0;
  if ((req_comp < 0) || (4 < req_comp)) {
    stbi__err("bad req_comp");
    p_local = (stbi__png *)0x0;
  }
  else {
    iVar1 = stbi__parse_png_file(p,0,req_comp);
    if (iVar1 != 0) {
      if (p->depth < 8) {
        ri->bits_per_channel = 8;
      }
      else {
        ri->bits_per_channel = p->depth;
      }
      local_48 = (stbi__png *)p->out;
      p->out = (stbi_uc *)0x0;
      if ((req_comp != 0) && (req_comp != p->s->img_out_n)) {
        if (ri->bits_per_channel == 8) {
          local_48 = (stbi__png *)
                     stbi__convert_format
                               ((uchar *)local_48,p->s->img_out_n,req_comp,p->s->img_x,p->s->img_y);
        }
        else {
          local_48 = (stbi__png *)
                     stbi__convert_format16
                               ((stbi__uint16 *)local_48,p->s->img_out_n,req_comp,p->s->img_x,
                                p->s->img_y);
        }
        p->s->img_out_n = req_comp;
        if (local_48 == (stbi__png *)0x0) {
          return (void *)0x0;
        }
      }
      *x = p->s->img_x;
      *y = p->s->img_y;
      if (n != (int *)0x0) {
        *n = p->s->img_n;
      }
    }
    free(p->out);
    p->out = (stbi_uc *)0x0;
    free(p->expanded);
    p->expanded = (stbi_uc *)0x0;
    free(p->idata);
    p->idata = (stbi_uc *)0x0;
    p_local = local_48;
  }
  return p_local;
}

Assistant:

static void *stbi__do_png(stbi__png *p, int *x, int *y, int *n, int req_comp, stbi__result_info *ri) {
  void *result = NULL;
  if (req_comp < 0 || req_comp > 4)
    return stbi__errpuc("bad req_comp", "Internal error");
  if (stbi__parse_png_file(p, STBI__SCAN_load, req_comp)) {
    if (p->depth < 8)
      ri->bits_per_channel = 8;
    else
      ri->bits_per_channel = p->depth;
    result = p->out;
    p->out = NULL;
    if (req_comp && req_comp != p->s->img_out_n) {
      if (ri->bits_per_channel == 8)
        result = stbi__convert_format((unsigned char *)result, p->s->img_out_n, req_comp, p->s->img_x, p->s->img_y);
      else
        result = stbi__convert_format16((stbi__uint16 *)result, p->s->img_out_n, req_comp, p->s->img_x, p->s->img_y);
      p->s->img_out_n = req_comp;
      if (result == NULL)
        return result;
    }
    *x = p->s->img_x;
    *y = p->s->img_y;
    if (n)
      *n = p->s->img_n;
  }
  STBI_FREE(p->out);
  p->out = NULL;
  STBI_FREE(p->expanded);
  p->expanded = NULL;
  STBI_FREE(p->idata);
  p->idata = NULL;

  return result;
}